

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int fast_expansion_sum_zeroelim(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar12 = *e;
  dVar10 = *f;
  bVar8 = dVar12 < dVar10 == dVar10 <= -dVar12;
  if (bVar8) {
    dVar9 = f[1];
    dVar13 = dVar12;
  }
  else {
    dVar9 = dVar10;
    dVar13 = e[1];
    dVar10 = dVar12;
  }
  uVar6 = (ulong)!bVar8;
  uVar4 = (ulong)bVar8;
  uVar5 = (uint)!bVar8;
  uVar3 = (uint)bVar8;
  uVar2 = 0;
  if ((int)uVar3 < flen && (int)uVar5 < elen) {
    if (dVar13 < dVar9 == dVar9 <= -dVar13) {
      dVar11 = dVar10 + dVar9;
      dVar12 = dVar11 - dVar9;
      uVar4 = (ulong)(uVar3 + 1);
      dVar9 = f[uVar4];
    }
    else {
      dVar11 = dVar10 + dVar13;
      dVar12 = dVar11 - dVar13;
      uVar6 = (ulong)(uVar5 + 1);
      dVar13 = e[uVar6];
    }
    dVar12 = dVar10 - dVar12;
    dVar10 = dVar11;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      *h = dVar12;
      uVar2 = 1;
    }
    else {
      uVar2 = 0;
    }
    while( true ) {
      uVar3 = (uint)uVar4;
      uVar5 = (uint)uVar6;
      if ((elen <= (int)uVar5) || (flen <= (int)uVar3)) break;
      if (dVar13 < dVar9 == dVar9 <= -dVar13) {
        dVar11 = dVar10 + dVar9;
        dVar12 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar9 - (dVar11 - dVar10));
        uVar4 = (ulong)(uVar3 + 1);
        dVar9 = f[(long)(int)uVar3 + 1];
      }
      else {
        dVar11 = dVar10 + dVar13;
        dVar12 = (dVar10 - (dVar11 - (dVar11 - dVar10))) + (dVar13 - (dVar11 - dVar10));
        uVar6 = (ulong)(uVar5 + 1);
        dVar13 = e[(long)(int)uVar5 + 1];
      }
      dVar10 = dVar11;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        h[uVar2] = dVar12;
        uVar2 = (ulong)((int)uVar2 + 1);
      }
    }
  }
  lVar7 = (long)(int)uVar5;
  while (lVar7 < elen) {
    dVar12 = dVar10 + dVar13;
    dVar11 = (dVar10 - (dVar12 - (dVar12 - dVar10))) + (dVar13 - (dVar12 - dVar10));
    dVar13 = e[lVar7 + 1];
    lVar7 = lVar7 + 1;
    dVar10 = dVar12;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      iVar1 = (int)uVar2;
      uVar2 = (ulong)(iVar1 + 1);
      h[iVar1] = dVar11;
    }
  }
  lVar7 = (long)(int)uVar3;
  while( true ) {
    iVar1 = (int)uVar2;
    if (flen <= lVar7) break;
    dVar12 = dVar10 + dVar9;
    dVar13 = (dVar10 - (dVar12 - (dVar12 - dVar10))) + (dVar9 - (dVar12 - dVar10));
    dVar9 = f[lVar7 + 1];
    lVar7 = lVar7 + 1;
    dVar10 = dVar12;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      uVar2 = (ulong)(iVar1 + 1);
      h[iVar1] = dVar13;
    }
  }
  if (((dVar10 == 0.0) && (!NAN(dVar10))) && (iVar1 != 0)) {
    return iVar1;
  }
  h[iVar1] = dVar10;
  return iVar1 + 1;
}

Assistant:

int fast_expansion_sum_zeroelim(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q;
  INEXACT REAL Qnew;
  INEXACT REAL hh;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    Q = enow;
    enow = e[++eindex];
  } else {
    Q = fnow;
    fnow = f[++findex];
  }
  hindex = 0;
  if ((eindex < elen) && (findex < flen)) {
    if ((fnow > enow) == (fnow > -enow)) {
      Fast_Two_Sum(enow, Q, Qnew, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, Q, Qnew, hh);
      fnow = f[++findex];
    }
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
    while ((eindex < elen) && (findex < flen)) {
      if ((fnow > enow) == (fnow > -enow)) {
        Two_Sum(Q, enow, Qnew, hh);
        enow = e[++eindex];
      } else {
        Two_Sum(Q, fnow, Qnew, hh);
        fnow = f[++findex];
      }
      Q = Qnew;
      if (hh != 0.0) {
        h[hindex++] = hh;
      }
    }
  }
  while (eindex < elen) {
    Two_Sum(Q, enow, Qnew, hh);
    enow = e[++eindex];
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  while (findex < flen) {
    Two_Sum(Q, fnow, Qnew, hh);
    fnow = f[++findex];
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}